

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::Validator::validate(Validator *this,Reader *structNode,uint64_t scopeId)

{
  Impl *pIVar1;
  unsigned_short uVar2;
  bool bVar3;
  uint16_t uVar4;
  Which WVar5;
  uint16_t uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint uVar9;
  ulong uVar10;
  bool *pbVar11;
  size_t sVar12;
  unsigned_short *puVar13;
  uint64_t uVar14;
  ArrayPtr<bool> AVar15;
  Iterator IVar16;
  ArrayPtr<const_char> name;
  bool local_76e;
  byte local_712;
  byte local_6da;
  Fault local_5e0;
  Fault f_10;
  unsigned_long *local_5d0;
  undefined1 local_5c8 [8];
  DebugComparison<unsigned_long_&,_int> _kjCondition_10;
  Fault f_9;
  uint *local_590;
  undefined1 local_588 [8];
  DebugComparison<unsigned_int_&,_unsigned_int> _kjCondition_9;
  Fault f_8;
  uint *local_550;
  undefined1 local_548 [8];
  DebugComparison<unsigned_int_&,_unsigned_short> _kjCondition_8;
  uint32_t local_4ec;
  Fault local_4e8;
  Fault f_7;
  DebugComparison<unsigned_int,_unsigned_int_&> local_4d8;
  bool local_4a9;
  undefined1 local_4a8 [7];
  bool _kjCondition_7;
  Reader local_478;
  bool local_445;
  uint local_444;
  undefined1 local_440 [3];
  bool fieldIsPointer;
  uint fieldBits;
  Reader slot;
  Fault f_6;
  uint *local_400;
  undefined1 local_3f8 [8];
  DebugComparison<unsigned_int_&,_unsigned_int> _kjCondition_6;
  Fault f_5;
  uint16_t local_3bc;
  DebugExpression<unsigned_short> local_3ba;
  DebugComparison<unsigned_short,_unsigned_long> local_3b8;
  bool local_389;
  bool _kjCondition_5;
  Fault f_4;
  undefined1 local_378 [8];
  DebugComparison<unsigned_short,_unsigned_int_&> _kjCondition_4;
  Reader ordinal;
  Fault f_3;
  uint16_t local_30c;
  DebugExpression<unsigned_short> local_30a;
  DebugComparison<unsigned_short,_unsigned_long> local_308;
  bool local_2d9;
  undefined1 auStack_2d8 [7];
  bool _kjCondition_3;
  size_t sStack_2d0;
  ArrayPtr<const_char> local_2c8;
  undefined1 local_2b0 [8];
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:341:7)>
  _kjContext341;
  anon_class_8_1_a7e8901a _kjContextFunc341;
  Reader field;
  undefined1 local_218 [8];
  Iterator __end2;
  undefined1 local_1f8 [8];
  Iterator __begin2;
  Reader *__range2;
  uint nextOrdinal;
  uint index;
  uint nonDiscriminantPos;
  uint discriminantPos;
  size_t sStack_1c8;
  Fault local_1c0;
  Fault f_2;
  undefined1 local_1b0 [8];
  DebugComparison<unsigned_int,_unsigned_int_&> _kjCondition_2;
  Fault f_1;
  undefined1 local_178 [8];
  DebugComparison<unsigned_short,_unsigned_int> _kjCondition_1;
  Fault local_150;
  Fault f;
  undefined1 local_140 [8];
  DebugComparison<unsigned_short,_int> _kjCondition;
  ArrayPtr<bool> sawDiscriminantValue;
  Array<bool> sawDiscriminantValue_heap;
  bool sawDiscriminantValue_stack [32];
  bool sawDiscriminantValue_isOnStack;
  size_t sawDiscriminantValue_size;
  undefined1 local_b0 [8];
  ArrayPtr<bool> sawCodeOrder;
  Array<bool> sawCodeOrder_heap;
  bool sawCodeOrder_stack [32];
  bool sawCodeOrder_isOnStack;
  size_t sawCodeOrder_size;
  Reader fields;
  uint pointerCount;
  uint dataSizeInBits;
  uint64_t scopeId_local;
  Reader *structNode_local;
  Validator *this_local;
  
  _pointerCount = scopeId;
  scopeId_local = (uint64_t)structNode;
  structNode_local = (Reader *)this;
  uVar4 = capnp::schema::Node::Struct::Reader::getDataWordCount(structNode);
  fields.reader._44_4_ = (uint)uVar4 << 6;
  uVar4 = capnp::schema::Node::Struct::Reader::getPointerCount((Reader *)scopeId_local);
  fields.reader.nestingLimit = (int)uVar4;
  capnp::schema::Node::Struct::Reader::getFields
            ((Reader *)&sawCodeOrder_size,(Reader *)scopeId_local);
  uVar7 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size((Reader *)&sawCodeOrder_size);
  uVar10 = (ulong)uVar7;
  if (uVar10 < 0x21) {
    kj::Array<bool>::Array((Array<bool> *)&sawCodeOrder.size_,(void *)0x0);
    AVar15 = kj::arrayPtr<bool>((bool *)&sawCodeOrder_heap.disposer,uVar10);
  }
  else {
    kj::heapArray<bool>((Array<bool> *)&sawCodeOrder.size_,uVar10);
    AVar15 = kj::Array::operator_cast_to_ArrayPtr((Array *)&sawCodeOrder.size_);
  }
  sawCodeOrder.ptr = (bool *)AVar15.size_;
  local_b0 = (undefined1  [8])AVar15.ptr;
  pbVar11 = kj::ArrayPtr<bool>::begin((ArrayPtr<bool> *)local_b0);
  sVar12 = kj::ArrayPtr<bool>::size((ArrayPtr<bool> *)local_b0);
  memset(pbVar11,0,sVar12);
  uVar4 = capnp::schema::Node::Struct::Reader::getDiscriminantCount((Reader *)scopeId_local);
  uVar10 = (ulong)uVar4;
  if (uVar10 < 0x21) {
    kj::Array<bool>::Array((Array<bool> *)&sawDiscriminantValue.size_,(void *)0x0);
    AVar15 = kj::arrayPtr<bool>((bool *)&sawDiscriminantValue_heap.disposer,uVar10);
  }
  else {
    kj::heapArray<bool>((Array<bool> *)&sawDiscriminantValue.size_,uVar10);
    AVar15 = kj::Array::operator_cast_to_ArrayPtr((Array *)&sawDiscriminantValue.size_);
  }
  sawDiscriminantValue.ptr = (bool *)AVar15.size_;
  _kjCondition._24_8_ = AVar15.ptr;
  pbVar11 = kj::ArrayPtr<bool>::begin((ArrayPtr<bool> *)&_kjCondition.result);
  sVar12 = kj::ArrayPtr<bool>::size((ArrayPtr<bool> *)&_kjCondition.result);
  memset(pbVar11,0,sVar12);
  uVar4 = capnp::schema::Node::Struct::Reader::getDiscriminantCount((Reader *)scopeId_local);
  if (uVar4 != 0) {
    f.exception._4_2_ =
         capnp::schema::Node::Struct::Reader::getDiscriminantCount((Reader *)scopeId_local);
    f.exception._6_2_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                    (unsigned_short *)((long)&f.exception + 4));
    f.exception._0_4_ = 1;
    kj::_::DebugExpression<unsigned_short>::operator!=
              ((DebugComparison<unsigned_short,_int> *)local_140,
               (DebugExpression<unsigned_short> *)((long)&f.exception + 6),(int *)&f);
    bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_140);
    if (!bVar3) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,int>&,char_const(&)[37]>
                (&local_150,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x146,FAILED,"structNode.getDiscriminantCount() != 1",
                 "_kjCondition,\"union must have at least two members\"",
                 (DebugComparison<unsigned_short,_int> *)local_140,
                 (char (*) [37])"union must have at least two members");
      this->isValid = false;
      _kjCondition_1._28_4_ = 1;
      kj::_::Debug::Fault::~Fault(&local_150);
      goto LAB_002c7302;
    }
    f_1.exception._4_2_ =
         capnp::schema::Node::Struct::Reader::getDiscriminantCount((Reader *)scopeId_local);
    f_1.exception._6_2_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                    (unsigned_short *)((long)&f_1.exception + 4));
    f_1.exception._0_4_ =
         List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size((Reader *)&sawCodeOrder_size);
    kj::_::DebugExpression<unsigned_short>::operator<=
              ((DebugComparison<unsigned_short,_unsigned_int> *)local_178,
               (DebugExpression<unsigned_short> *)((long)&f_1.exception + 6),(uint *)&f_1);
    bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_178);
    if (!bVar3) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int>&,char_const(&)[54]>
                ((Fault *)&_kjCondition_2.result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x148,FAILED,"structNode.getDiscriminantCount() <= fields.size()",
                 "_kjCondition,\"struct can\'t have more union fields than total fields\"",
                 (DebugComparison<unsigned_short,_unsigned_int> *)local_178,
                 (char (*) [54])"struct can\'t have more union fields than total fields");
      this->isValid = false;
      _kjCondition_1._28_4_ = 1;
      kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_2.result);
      goto LAB_002c7302;
    }
    uVar8 = capnp::schema::Node::Struct::Reader::getDiscriminantOffset((Reader *)scopeId_local);
    f_2.exception._0_4_ = uVar8 * 0x10 + 0x10;
    f_2.exception._4_4_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)&f_2);
    kj::_::DebugExpression<unsigned_int>::operator<=
              ((DebugComparison<unsigned_int,_unsigned_int_&> *)local_1b0,
               (DebugExpression<unsigned_int> *)((long)&f_2.exception + 4),
               (uint *)&fields.reader.field_0x2c);
    bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1b0);
    if (!bVar3) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int&>&,char_const(&)[36]>
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x14b,FAILED,"(structNode.getDiscriminantOffset() + 1) * 16 <= dataSizeInBits",
                 "_kjCondition,\"union discriminant is out-of-bounds\"",
                 (DebugComparison<unsigned_int,_unsigned_int_&> *)local_1b0,
                 (char (*) [36])"union discriminant is out-of-bounds");
      this->isValid = false;
      _kjCondition_1._28_4_ = 1;
      kj::_::Debug::Fault::~Fault(&local_1c0);
      goto LAB_002c7302;
    }
  }
  pIVar1 = this->loader;
  uVar7 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size((Reader *)&sawCodeOrder_size);
  _nonDiscriminantPos = kj::Arena::allocateArray<unsigned_short>(&pIVar1->arena,(ulong)uVar7);
  this->membersByDiscriminant = _nonDiscriminantPos;
  index = 0;
  uVar4 = capnp::schema::Node::Struct::Reader::getDiscriminantCount((Reader *)scopeId_local);
  nextOrdinal = (uint)uVar4;
  __range2._4_4_ = 0;
  __range2._0_4_ = 0;
  __begin2._8_8_ = &sawCodeOrder_size;
  IVar16 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::begin((Reader *)__begin2._8_8_);
  __end2._8_8_ = IVar16.container;
  __begin2.container._0_4_ = IVar16.index;
  local_1f8 = (undefined1  [8])__end2._8_8_;
  IVar16 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::end((Reader *)__begin2._8_8_);
  local_218 = (undefined1  [8])IVar16.container;
  __end2.container._0_4_ = IVar16.index;
  while( true ) {
    bVar3 = capnp::_::
            IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
            ::operator==((IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                          *)local_1f8,
                         (IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                          *)local_218);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
    ::operator*((Reader *)&_kjContextFunc341,
                (IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                 *)local_1f8);
    _kjContext341.func = &_kjContextFunc341;
    kj::_::Debug::
    ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++:341:7)>
    ::ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:341:7)>
                   *)local_2b0,(anon_class_8_1_a7e8901a *)&_kjContext341.func);
    name = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&_kjContextFunc341)
    ;
    _auStack_2d8 = name;
    local_2c8 = name;
    validateMemberName(this,(StringPtr)name,__range2._4_4_);
    local_30c = capnp::schema::Field::Reader::getCodeOrder((Reader *)&_kjContextFunc341);
    local_30a = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_30c);
    f_3.exception = (Exception *)kj::ArrayPtr<bool>::size((ArrayPtr<bool> *)local_b0);
    kj::_::DebugExpression<unsigned_short>::operator<(&local_308,&local_30a,(unsigned_long *)&f_3);
    bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_308);
    local_6da = 0;
    if (bVar3) {
      uVar4 = capnp::schema::Field::Reader::getCodeOrder((Reader *)&_kjContextFunc341);
      pbVar11 = kj::ArrayPtr<bool>::operator[]((ArrayPtr<bool> *)local_b0,(ulong)uVar4);
      local_6da = *pbVar11 ^ 0xff;
    }
    local_2d9 = (bool)(local_6da & 1);
    if (local_2d9 == false) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[18]>
                ((Fault *)&ordinal._reader.nestingLimit,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x15a,FAILED,
                 "field.getCodeOrder() < sawCodeOrder.size() && !sawCodeOrder[field.getCodeOrder()]"
                 ,"_kjCondition,\"invalid codeOrder\"",&local_2d9,(char (*) [18])"invalid codeOrder"
                );
      this->isValid = false;
      _kjCondition_1._28_4_ = 1;
      kj::_::Debug::Fault::~Fault((Fault *)&ordinal._reader.nestingLimit);
    }
    else {
      uVar4 = capnp::schema::Field::Reader::getCodeOrder((Reader *)&_kjContextFunc341);
      pbVar11 = kj::ArrayPtr<bool>::operator[]((ArrayPtr<bool> *)local_b0,(ulong)uVar4);
      *pbVar11 = true;
      capnp::schema::Field::Reader::getOrdinal
                ((Reader *)&_kjCondition_4.result,(Reader *)&_kjContextFunc341);
      bVar3 = capnp::schema::Field::Ordinal::Reader::isExplicit((Reader *)&_kjCondition_4.result);
      if (bVar3) {
        f_4.exception._4_2_ =
             capnp::schema::Field::Ordinal::Reader::getExplicit((Reader *)&_kjCondition_4.result);
        f_4.exception._6_2_ =
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (unsigned_short *)((long)&f_4.exception + 4));
        kj::_::DebugExpression<unsigned_short>::operator>=
                  ((DebugComparison<unsigned_short,_unsigned_int_&> *)local_378,
                   (DebugExpression<unsigned_short> *)((long)&f_4.exception + 6),(uint *)&__range2);
        bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_378);
        if (!bVar3) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int&>&,char_const(&)[35]>
                    ((Fault *)&stack0xfffffffffffffc78,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x160,FAILED,"ordinal.getExplicit() >= nextOrdinal",
                     "_kjCondition,\"fields were not ordered by ordinal\"",
                     (DebugComparison<unsigned_short,_unsigned_int_&> *)local_378,
                     (char (*) [35])"fields were not ordered by ordinal");
          this->isValid = false;
          _kjCondition_1._28_4_ = 1;
          kj::_::Debug::Fault::~Fault((Fault *)&stack0xfffffffffffffc78);
          goto LAB_002c6f40;
        }
        uVar4 = capnp::schema::Field::Ordinal::Reader::getExplicit((Reader *)&_kjCondition_4.result)
        ;
        __range2._0_4_ = uVar4 + 1;
      }
      bVar3 = hasDiscriminantValue((Reader *)&_kjContextFunc341);
      if (bVar3) {
        local_3bc = capnp::schema::Field::Reader::getDiscriminantValue((Reader *)&_kjContextFunc341)
        ;
        local_3ba = kj::_::DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3bc);
        f_5.exception =
             (Exception *)kj::ArrayPtr<bool>::size((ArrayPtr<bool> *)&_kjCondition.result);
        kj::_::DebugExpression<unsigned_short>::operator<
                  (&local_3b8,&local_3ba,(unsigned_long *)&f_5);
        bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_3b8);
        local_712 = 0;
        if (bVar3) {
          uVar4 = capnp::schema::Field::Reader::getDiscriminantValue((Reader *)&_kjContextFunc341);
          pbVar11 = kj::ArrayPtr<bool>::operator[]
                              ((ArrayPtr<bool> *)&_kjCondition.result,(ulong)uVar4);
          local_712 = *pbVar11 ^ 0xff;
        }
        local_389 = (bool)(local_712 & 1);
        if (local_389 != false) {
          uVar4 = capnp::schema::Field::Reader::getDiscriminantValue((Reader *)&_kjContextFunc341);
          pbVar11 = kj::ArrayPtr<bool>::operator[]
                              ((ArrayPtr<bool> *)&_kjCondition.result,(ulong)uVar4);
          *pbVar11 = true;
          uVar2 = __range2._4_2_;
          uVar10 = (ulong)index;
          index = index + 1;
          puVar13 = kj::ArrayPtr<unsigned_short>::operator[](&this->membersByDiscriminant,uVar10);
          *puVar13 = uVar2;
          goto LAB_002c6c83;
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[26]>
                  ((Fault *)&_kjCondition_6.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x167,FAILED,
                   "field.getDiscriminantValue() < sawDiscriminantValue.size() && !sawDiscriminantValue[field.getDiscriminantValue()]"
                   ,"_kjCondition,\"invalid discriminantValue\"",&local_389,
                   (char (*) [26])"invalid discriminantValue");
        this->isValid = false;
        _kjCondition_1._28_4_ = 1;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_6.result);
      }
      else {
        local_400 = (uint *)kj::_::DebugExpressionStart::operator<<
                                      ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&nextOrdinal);
        f_6.exception._4_4_ =
             List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size((Reader *)&sawCodeOrder_size);
        kj::_::DebugExpression<unsigned_int&>::operator<=
                  ((DebugComparison<unsigned_int_&,_unsigned_int> *)local_3f8,
                   (DebugExpression<unsigned_int&> *)&local_400,(uint *)((long)&f_6.exception + 4));
        bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3f8);
        if (bVar3) {
          uVar2 = __range2._4_2_;
          uVar10 = (ulong)nextOrdinal;
          nextOrdinal = nextOrdinal + 1;
          puVar13 = kj::ArrayPtr<unsigned_short>::operator[](&this->membersByDiscriminant,uVar10);
          *puVar13 = uVar2;
LAB_002c6c83:
          WVar5 = capnp::schema::Field::Reader::which((Reader *)&_kjContextFunc341);
          if (WVar5 == SLOT) {
            capnp::schema::Field::Reader::getSlot((Reader *)local_440,(Reader *)&_kjContextFunc341);
            local_444 = 0;
            local_445 = false;
            capnp::schema::Field::Slot::Reader::getType(&local_478,(Reader *)local_440);
            capnp::schema::Field::Slot::Reader::getDefaultValue
                      ((Reader *)local_4a8,(Reader *)local_440);
            validate(this,&local_478,(Reader *)local_4a8,&local_444,&local_445);
            uVar7 = local_444;
            uVar8 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)local_440);
            f_7.exception._0_4_ = uVar7 * (uVar8 + 1);
            f_7.exception._4_4_ =
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)&f_7);
            kj::_::DebugExpression<unsigned_int>::operator<=
                      (&local_4d8,(DebugExpression<unsigned_int> *)((long)&f_7.exception + 4),
                       (uint *)&fields.reader.field_0x2c);
            bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_4d8);
            local_76e = false;
            if (bVar3) {
              uVar9 = (uint)local_445;
              uVar8 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)local_440);
              local_76e = (uVar9 & 1) * (uVar8 + 1) <= (uint)fields.reader.nestingLimit;
            }
            local_4a9 = local_76e;
            if (local_76e == false) {
              local_4ec = capnp::schema::Field::Slot::Reader::getOffset((Reader *)local_440);
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,bool&,char_const(&)[27],unsigned_int,unsigned_int&,unsigned_int&>
                        (&local_4e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                         ,0x17b,FAILED,
                         "fieldBits * (slot.getOffset() + 1) <= dataSizeInBits && fieldIsPointer * (slot.getOffset() + 1) <= pointerCount"
                         ,
                         "_kjCondition,\"field offset out-of-bounds\", slot.getOffset(), dataSizeInBits, pointerCount"
                         ,&local_4a9,(char (*) [27])"field offset out-of-bounds",&local_4ec,
                         (uint *)&fields.reader.field_0x2c,(uint *)&fields.reader.nestingLimit);
              this->isValid = false;
              _kjCondition_1._28_4_ = 1;
              kj::_::Debug::Fault::~Fault(&local_4e8);
              goto LAB_002c6f40;
            }
          }
          else if (WVar5 == GROUP) {
            capnp::schema::Field::Reader::getGroup
                      ((Reader *)&_kjCondition_8.result,(Reader *)&_kjContextFunc341);
            uVar14 = capnp::schema::Field::Group::Reader::getTypeId
                               ((Reader *)&_kjCondition_8.result);
            validateTypeId(this,uVar14,STRUCT);
          }
          __range2._4_4_ = __range2._4_4_ + 1;
          _kjCondition_1._28_4_ = 0;
        }
        else {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[39]>
                    ((Fault *)&slot._reader.nestingLimit,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x16d,FAILED,"nonDiscriminantPos <= fields.size()",
                     "_kjCondition,\"discriminantCount did not match fields\"",
                     (DebugComparison<unsigned_int_&,_unsigned_int> *)local_3f8,
                     (char (*) [39])"discriminantCount did not match fields");
          this->isValid = false;
          _kjCondition_1._28_4_ = 1;
          kj::_::Debug::Fault::~Fault((Fault *)&slot._reader.nestingLimit);
        }
      }
    }
LAB_002c6f40:
    kj::_::Debug::
    ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++:341:7)>
    ::~ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:341:7)>
                    *)local_2b0);
    if (_kjCondition_1._28_4_ != 0) goto LAB_002c7302;
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                  *)local_1f8);
  }
  local_550 = (uint *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&index);
  f_8.exception._6_2_ =
       capnp::schema::Node::Struct::Reader::getDiscriminantCount((Reader *)scopeId_local);
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_unsigned_short> *)local_548,
             (DebugExpression<unsigned_int&> *)&local_550,
             (unsigned_short *)((long)&f_8.exception + 6));
  bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_548);
  if (!bVar3) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_short>&>
              ((Fault *)&_kjCondition_9.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x18a,FAILED,"discriminantPos == structNode.getDiscriminantCount()","_kjCondition,",
               (DebugComparison<unsigned_int_&,_unsigned_short> *)local_548);
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_9.result);
  }
  local_590 = (uint *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&nextOrdinal);
  f_9.exception._4_4_ =
       List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size((Reader *)&sawCodeOrder_size);
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_unsigned_int> *)local_588,
             (DebugExpression<unsigned_int&> *)&local_590,(uint *)((long)&f_9.exception + 4));
  bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_588);
  if (!bVar3) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&>
              ((Fault *)&_kjCondition_10.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x18b,FAILED,"nonDiscriminantPos == fields.size()","_kjCondition,",
               (DebugComparison<unsigned_int_&,_unsigned_int> *)local_588);
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_10.result);
  }
  bVar3 = capnp::schema::Node::Struct::Reader::getIsGroup((Reader *)scopeId_local);
  if (bVar3) {
    local_5d0 = (unsigned_long *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (unsigned_long *)&pointerCount);
    f_10.exception._4_4_ = 0;
    kj::_::DebugExpression<unsigned_long&>::operator!=
              ((DebugComparison<unsigned_long_&,_int> *)local_5c8,
               (DebugExpression<unsigned_long&> *)&local_5d0,(int *)((long)&f_10.exception + 4));
    bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5c8);
    uVar14 = _pointerCount;
    if (!bVar3) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[27]>
                (&local_5e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x18e,FAILED,"scopeId != 0","_kjCondition,\"group node missing scopeId\"",
                 (DebugComparison<unsigned_long_&,_int> *)local_5c8,
                 (char (*) [27])"group node missing scopeId");
      this->isValid = false;
      _kjCondition_1._28_4_ = 1;
      kj::_::Debug::Fault::~Fault(&local_5e0);
      goto LAB_002c7302;
    }
    pIVar1 = this->loader;
    uVar4 = capnp::schema::Node::Struct::Reader::getDataWordCount((Reader *)scopeId_local);
    uVar6 = capnp::schema::Node::Struct::Reader::getPointerCount((Reader *)scopeId_local);
    SchemaLoader::Impl::requireStructSize(pIVar1,uVar14,(uint)uVar4,(uint)uVar6);
    validateTypeId(this,_pointerCount,STRUCT);
  }
  _kjCondition_1._28_4_ = 0;
LAB_002c7302:
  kj::Array<bool>::~Array((Array<bool> *)&sawDiscriminantValue.size_);
  kj::Array<bool>::~Array((Array<bool> *)&sawCodeOrder.size_);
  return;
}

Assistant:

void validate(const schema::Node::Struct::Reader& structNode, uint64_t scopeId) {
    uint dataSizeInBits = structNode.getDataWordCount() * 64;
    uint pointerCount = structNode.getPointerCount();

    auto fields = structNode.getFields();

    KJ_STACK_ARRAY(bool, sawCodeOrder, fields.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    KJ_STACK_ARRAY(bool, sawDiscriminantValue, structNode.getDiscriminantCount(), 32, 256);
    memset(sawDiscriminantValue.begin(), 0,
           sawDiscriminantValue.size() * sizeof(sawDiscriminantValue[0]));

    if (structNode.getDiscriminantCount() > 0) {
      VALIDATE_SCHEMA(structNode.getDiscriminantCount() != 1,
                      "union must have at least two members");
      VALIDATE_SCHEMA(structNode.getDiscriminantCount() <= fields.size(),
                      "struct can't have more union fields than total fields");

      VALIDATE_SCHEMA((structNode.getDiscriminantOffset() + 1) * 16 <= dataSizeInBits,
                      "union discriminant is out-of-bounds");
    }